

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O1

void wal_set_dirty_status(filemgr *file,wal_dirty_t status,bool set_on_non_pending)

{
  undefined3 in_register_00000011;
  wal *pwVar1;
  
  pthread_spin_lock(&file->wal->lock);
  if ((CONCAT31(in_register_00000011,set_on_non_pending) == 0) ||
     (pwVar1 = file->wal, pwVar1->wal_dirty != '\x02')) {
    pwVar1 = file->wal;
    pwVar1->wal_dirty = status;
  }
  pthread_spin_unlock(&pwVar1->lock);
  return;
}

Assistant:

void wal_set_dirty_status(struct filemgr *file,
                          wal_dirty_t status,
                          bool set_on_non_pending)
{
    spin_lock(&file->wal->lock);
    if (set_on_non_pending && file->wal->wal_dirty == FDB_WAL_PENDING) {
        spin_unlock(&file->wal->lock);
        return;
    }
    file->wal->wal_dirty = status;
    spin_unlock(&file->wal->lock);
}